

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getDataFromBuffer(File *this)

{
  uchar *puVar1;
  unsigned_long *__args_1;
  unique_ptr<lrit::(anonymous_namespace)::memstream,_std::default_delete<lrit::(anonymous_namespace)::memstream>_>
  *in_RSI;
  __uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
  in_RDI;
  __single_object ms;
  pointer in_stack_ffffffffffffffb8;
  uchar **in_stack_ffffffffffffffe8;
  
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11df6e);
  __args_1 = (unsigned_long *)
             (puVar1 + *(uint *)&((_Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                   *)&in_RSI[0x11]._M_t.
                                      super___uniq_ptr_impl<lrit::(anonymous_namespace)::memstream,_std::default_delete<lrit::(anonymous_namespace)::memstream>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_lrit::(anonymous_namespace)::memstream_*,_std::default_delete<lrit::(anonymous_namespace)::memstream>_>
                                      .
                                      super__Head_base<0UL,_lrit::(anonymous_namespace)::memstream_*,_false>
                                 )->_M_head_impl);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 4));
  std::make_unique<lrit::(anonymous_namespace)::memstream,unsigned_char_const*,unsigned_long>
            (in_stack_ffffffffffffffe8,__args_1);
  std::
  unique_ptr<lrit::(anonymous_namespace)::memstream,_std::default_delete<lrit::(anonymous_namespace)::memstream>_>
  ::release((unique_ptr<lrit::(anonymous_namespace)::memstream,_std::default_delete<lrit::(anonymous_namespace)::memstream>_>
             *)0x11dfbb);
  std::unique_ptr<std::istream,std::default_delete<std::istream>>::
  unique_ptr<std::default_delete<std::istream>,void>
            ((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              *)in_RSI,in_stack_ffffffffffffffb8);
  std::
  unique_ptr<lrit::(anonymous_namespace)::memstream,_std::default_delete<lrit::(anonymous_namespace)::memstream>_>
  ::~unique_ptr(in_RSI);
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<std::istream> File::getDataFromBuffer() const {
  auto ms = std::make_unique<memstream>(
    buf_.data() + ph_.totalHeaderLength,
    buf_.size() - ph_.totalHeaderLength);
  return std::unique_ptr<std::istream>(ms.release());
}